

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadAlignment
          (BinaryReader *this,Address *alignment_log2,char *desc)

{
  bool bVar1;
  Result result;
  uint local_2c;
  char *pcStack_28;
  uint32_t value;
  char *desc_local;
  Address *alignment_log2_local;
  BinaryReader *this_local;
  
  pcStack_28 = desc;
  desc_local = (char *)alignment_log2;
  alignment_log2_local = &this->read_end_;
  result = ReadU32Leb128(this,&local_2c,desc);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if (local_2c < 0x20) {
    *(ulong *)desc_local = (ulong)local_2c;
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"invalid %s: %u",pcStack_28,(ulong)local_2c);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadAlignment(Address* alignment_log2, const char* desc) {
  uint32_t value;
  CHECK_RESULT(ReadU32Leb128(&value, desc));
  if (value >= 32) {
    PrintError("invalid %s: %u", desc, value);
    return Result::Error;
  }
  *alignment_log2 = value;
  return Result::Ok;
}